

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (factor != 1) {
    if (factor == 0) {
      this->used_bigits_ = 0;
      this->exponent_ = 0;
      return;
    }
    uVar1 = this->used_bigits_;
    if ((ulong)uVar1 != 0) {
      if ((short)uVar1 < 1) {
        uVar4 = 0;
      }
      else {
        uVar6 = 0;
        uVar4 = 0;
        do {
          uVar2 = this->bigits_buffer_[uVar6];
          uVar7 = (ulong)((uint)uVar4 & 0xfffffff) + (factor & 0xffffffff) * (ulong)uVar2;
          this->bigits_buffer_[uVar6] = (uint)uVar7 & 0xfffffff;
          uVar4 = (ulong)uVar2 * (factor >> 0x1c & 0xfffffffffffffff0) + (uVar4 >> 0x1c) +
                  (uVar7 >> 0x1c);
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      if (uVar4 != 0) {
        lVar5 = (long)this->used_bigits_;
        do {
          if (0x7f < (short)lVar5) {
            abort();
          }
          this->bigits_buffer_[lVar5] = (uint)uVar4 & 0xfffffff;
          lVar5 = lVar5 + 1;
          this->used_bigits_ = (int16_t)lVar5;
          bVar3 = 0xfffffff < uVar4;
          uVar4 = uVar4 >> 0x1c;
        } while (bVar3);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(const uint64_t factor) {
  if (factor == 1) {
    return;
  }
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_bigits_ == 0) {
    return;
  }
  DOUBLE_CONVERSION_ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  const uint64_t low = factor & 0xFFFFFFFF;
  const uint64_t high = factor >> 32;
  for (int i = 0; i < used_bigits_; ++i) {
    const uint64_t product_low = low * RawBigit(i);
    const uint64_t product_high = high * RawBigit(i);
    const uint64_t tmp = (carry & kBigitMask) + product_low;
    RawBigit(i) = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_bigits_ + 1);
    RawBigit(used_bigits_) = carry & kBigitMask;
    used_bigits_++;
    carry >>= kBigitSize;
  }
}